

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall google::protobuf::SourceCodeInfo::ByteSizeLong(SourceCodeInfo *this)

{
  bool bVar1;
  int iVar2;
  RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> *this_00;
  reference value;
  size_t sVar3;
  SourceCodeInfo_Location *msg;
  const_iterator __end3;
  const_iterator __begin3;
  RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> *__range3;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  SourceCodeInfo *this_;
  SourceCodeInfo *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  sStack_58 = internal::ExtensionSet::ByteSize(&(this->field_0)._impl_._extensions_);
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  iVar2 = _internal_location_size(this);
  sStack_58 = (long)iVar2 + sStack_58;
  this_00 = _internal_location(this);
  __end3 = RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::begin(this_00);
  msg = (SourceCodeInfo_Location *)
        RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::end(this_00);
  while( true ) {
    bVar1 = internal::operator!=(&__end3,(iterator *)&msg);
    if (!bVar1) break;
    value = internal::RepeatedPtrIterator<const_google::protobuf::SourceCodeInfo_Location>::
            operator*(&__end3);
    sVar3 = internal::WireFormatLite::MessageSize<google::protobuf::SourceCodeInfo_Location>(value);
    sStack_58 = sVar3 + sStack_58;
    internal::RepeatedPtrIterator<const_google::protobuf::SourceCodeInfo_Location>::operator++
              (&__end3);
  }
  sVar3 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar3;
}

Assistant:

::size_t SourceCodeInfo::ByteSizeLong() const {
  const SourceCodeInfo& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.SourceCodeInfo)
  ::size_t total_size = 0;
  total_size += this_._impl_._extensions_.ByteSize();

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .google.protobuf.SourceCodeInfo.Location location = 1;
    {
      total_size += 1UL * this_._internal_location_size();
      for (const auto& msg : this_._internal_location()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}